

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

QString * __thiscall
QMimeBinaryProvider::resolveAlias
          (QString *__return_storage_ptr__,QMimeBinaryProvider *this,QString *name)

{
  uchar *puVar1;
  DataPointer *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  char *str2;
  QString *this_00;
  uint uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArray local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper(&local_78,name);
  puVar1 = ((this->m_cacheFile)._M_t.
            super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
            ._M_t.
            super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
            .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->data;
  uVar4 = *(uint *)(puVar1 + 4);
  uVar9 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  uVar4 = *(uint *)(puVar1 + (int)uVar9);
  uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
  if (0 < (int)uVar4) {
    iVar5 = uVar4 - 1;
    iVar7 = 0;
    do {
      str2 = local_78.d.ptr;
      if (local_78.d.ptr == (char *)0x0) {
        str2 = &QByteArray::_empty;
      }
      uVar6 = (uint)(iVar5 + iVar7) >> 1;
      puVar1 = ((this->m_cacheFile)._M_t.
                super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                ._M_t.
                super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->data;
      lVar8 = (long)(int)(uVar9 + 4 + uVar6 * 8);
      uVar4 = *(uint *)(puVar1 + lVar8);
      iVar3 = qstrcmp((char *)(puVar1 + (int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                              (uVar4 & 0xff00) << 8 | uVar4 << 0x18)),str2);
      if (iVar3 < 0) {
        iVar7 = uVar6 + 1;
      }
      else {
        if (iVar3 == 0) {
          puVar1 = ((this->m_cacheFile)._M_t.
                    super___uniq_ptr_impl<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_QMimeBinaryProvider::CacheFile_*,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    .super__Head_base<0UL,_QMimeBinaryProvider::CacheFile_*,_false>._M_head_impl)->
                   data;
          uVar4 = *(uint *)(puVar1 + lVar8 + 4);
          ba.m_data._0_4_ =
               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
          ba.m_size = puVar1 + (int)(uint)ba.m_data;
          this_00 = (QString *)0xffffffffffffffff;
          do {
            pDVar2 = &this_00->d;
            this_00 = (QString *)((long)&(this_00->d).d + 1);
          } while (*(uchar *)((long)&pDVar2->d + (long)(ba.m_size + 1)) != '\0');
          ba.m_data._4_4_ = 0;
          QString::fromLatin1(&local_58,this_00,ba);
          (__return_storage_ptr__->d).d = local_58.d.d;
          (__return_storage_ptr__->d).ptr = local_58.d.ptr;
          (__return_storage_ptr__->d).size = local_58.d.size;
          goto LAB_004aa542;
        }
        iVar5 = uVar6 - 1;
      }
    } while (iVar7 <= iVar5);
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_004aa542:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QMimeBinaryProvider::resolveAlias(const QString &name)
{
    const QByteArray input = name.toLatin1();
    const int aliasListOffset = m_cacheFile->getUint32(PosAliasListOffset);
    const int numEntries = m_cacheFile->getUint32(aliasListOffset);
    int begin = 0;
    int end = numEntries - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = aliasListOffset + 4 + 8 * medium;
        const int aliasOffset = m_cacheFile->getUint32(off);
        const char *alias = m_cacheFile->getCharStar(aliasOffset);
        const int cmp = qstrcmp(alias, input);
        if (cmp < 0) {
            begin = medium + 1;
        } else if (cmp > 0) {
            end = medium - 1;
        } else {
            const int mimeOffset = m_cacheFile->getUint32(off + 4);
            const char *mimeType = m_cacheFile->getCharStar(mimeOffset);
            return QLatin1StringView(mimeType);
        }
    }
    return QString();
}